

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

void gmlc::utilities::string_viewOps::trimString(string_view *input,string_view trimCharacters)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> *this;
  size_type sVar1;
  unsigned_long *puVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  size_type in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  size_type local_58;
  undefined8 local_50;
  undefined8 local_48;
  size_type local_40;
  size_type local_38;
  undefined8 local_30;
  undefined8 local_28;
  unsigned_long local_20;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_18 = in_RDI;
  local_10 = in_RSI;
  local_8 = in_RDX;
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(in_RDI);
  local_30 = local_10;
  local_28 = local_8;
  __str._M_str = in_stack_ffffffffffffffa0;
  __str._M_len = (size_t)in_RDI;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (this,__str,in_stack_ffffffffffffff88);
  local_20 = sVar1 + 1;
  local_38 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_18);
  puVar2 = CLI::std::min<unsigned_long>(&local_20,&local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(long)this - *puVar2);
  local_50 = local_10;
  local_48 = local_8;
  __str_00._M_str = (char *)local_18;
  __str_00._M_len = (size_t)in_RDI;
  this_00 = local_18;
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                       (this,__str_00,in_stack_ffffffffffffff88);
  local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_18);
  puVar2 = CLI::std::min<unsigned_long>(&local_40,&local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,*puVar2);
  return;
}

Assistant:

void trimString(std::string_view& input, std::string_view trimCharacters)
{
    input.remove_suffix(
        input.length() -
        std::min(input.find_last_not_of(trimCharacters) + 1, input.size()));
    input.remove_prefix(
        std::min(input.find_first_not_of(trimCharacters), input.size()));
}